

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

bool __thiscall libcellml::Importer::addModel(Importer *this,ModelPtr *model,string *key)

{
  ImporterImpl *pIVar1;
  size_type sVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>
  local_88;
  undefined4 local_58;
  undefined1 local_48 [8];
  string normalisedKey;
  string *key_local;
  ModelPtr *model_local;
  Importer *this_local;
  
  normalisedKey.field_2._8_8_ = key;
  normaliseDirectorySeparator((string *)local_48,key);
  pIVar1 = pFunc(this);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
          ::count(&pIVar1->mLibrary,(key_type *)local_48);
  if (sVar2 == 0) {
    pIVar1 = pFunc(this);
    std::make_pair<std::__cxx11::string&,std::shared_ptr<libcellml::Model>const&>
              (&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,model);
    std::
    map<std::__cxx11::string,std::shared_ptr<libcellml::Model>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>>
    ::insert<std::pair<std::__cxx11::string,std::shared_ptr<libcellml::Model>>>
              ((map<std::__cxx11::string,std::shared_ptr<libcellml::Model>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>>
                *)&pIVar1->mLibrary,&local_88);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>
    ::~pair(&local_88);
  }
  local_58 = 1;
  std::__cxx11::string::~string((string *)local_48);
  return sVar2 == 0;
}

Assistant:

bool Importer::addModel(const ModelPtr &model, const std::string &key)
{
    auto normalisedKey = normaliseDirectorySeparator(key);
    if (pFunc()->mLibrary.count(normalisedKey) != 0) {
        // If the key already exists in the library, do nothing.
        return false;
    }
    pFunc()->mLibrary.insert(std::make_pair(normalisedKey, model));
    return true;
}